

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.cc
# Opt level: O2

void print_raw_text(int f,string s,v_array<char> tag)

{
  ulong uVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  string *in_RSI;
  void *local_1c0;
  ulong local_1b8;
  stringstream ss;
  ostream local_190;
  
  if (-1 < f) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::operator<<(&local_190,in_RSI);
    print_tag(&ss,(v_array<char>)s);
    std::operator<<(&local_190,'\n');
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::stringbuf::str();
    uVar1 = io_buf::write_file_or_socket(f,local_1c0,local_1b8 & 0xffffffff);
    std::__cxx11::string::~string((string *)&local_1c0);
    if (uVar1 != local_1b8) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"write error: ");
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      poVar2 = std::operator<<(poVar2,pcVar4);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  return;
}

Assistant:

void print_raw_text(int f, string s, v_array<char> tag)
{
  if (f < 0)
    return;

  std::stringstream ss;
  ss << s;
  print_tag(ss, tag);
  ss << '\n';
  ssize_t len = ss.str().size();
  ssize_t t = io_buf::write_file_or_socket(f, ss.str().c_str(), (unsigned int)len);
  if (t != len)
  {
    cerr << "write error: " << strerror(errno) << endl;
  }
}